

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootExpression.cpp
# Opt level: O2

BaseExpressionPtr __thiscall
Kandinsky::SquareRootExpression::derivative
          (SquareRootExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *arg;
  BaseExpressionPtr BVar1;
  shared_ptr<Kandinsky::BaseExpression> sStack_88;
  Expression local_78;
  Expression local_60;
  UnaryExpression local_48;
  double local_30;
  
  local_30 = 0.5;
  arg = &(variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount;
  sqrt<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            ((SquareRootExpression *)&local_48,(shared_ptr<Kandinsky::BaseExpression> *)arg);
  operator/<double,_Kandinsky::SquareRootExpression,_nullptr>
            (&local_78,&local_30,(SquareRootExpression *)&local_48);
  (*arg->_M_pi->_vptr__Sp_counted_base[1])(&sStack_88);
  operator*<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_60,&local_78,&sStack_88);
  BaseExpression::makePtr<Kandinsky::Expression>((BaseExpression *)this,&local_60);
  Expression::~Expression(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_88.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Expression::~Expression(&local_78);
  UnaryExpression::~UnaryExpression(&local_48);
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr SquareRootExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(0.5 / sqrt(m_arg) * m_arg->derivative(variable));
    }